

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenEnum_ObjectAPI
          (CSharpGenerator *this,EnumDef *enum_def,string *code_ptr,IDLOptions *opts)

{
  Type *pTVar1;
  long lVar2;
  string *psVar3;
  __type _Var4;
  bool bVar5;
  Value *pVVar6;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar7;
  const_reference ppEVar8;
  char *__s;
  reference ppEVar9;
  string local_da8;
  string local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  undefined8 local_c68;
  StructDef *pSStack_c60;
  EnumDef *local_c58;
  undefined8 uStack_c50;
  undefined1 local_c48 [8];
  string type_name_1;
  EnumVal *ev_2;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_c18;
  const_iterator it_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  allocator<char> local_949;
  string local_948;
  string local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  string local_868;
  string local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  EnumVal *local_7a8;
  EnumVal *ev_1;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_798;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  string local_750;
  string local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  char *local_490;
  char *local_488;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  undefined1 local_470 [8];
  string lower_ev_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  allocator<char> local_34c;
  byte local_34b;
  byte local_34a;
  allocator<char> local_349;
  string local_348;
  undefined1 local_328 [8];
  string accessibility;
  undefined1 local_2e8 [8];
  string type_name;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_2b8;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  string class_member;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> union_name;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *code;
  IDLOptions *opts_local;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  CSharpGenerator *this_local;
  
  if ((((enum_def->super_Definition).generated & 1U) == 0) && ((enum_def->is_union & 1U) != 0)) {
    local_30 = code_ptr;
    code = (string *)opts;
    opts_local = (IDLOptions *)code_ptr;
    code_ptr_local = (string *)enum_def;
    enum_def_local = (EnumDef *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"private",&local_51);
    pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(enum_def->super_Definition).attributes,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if (pVVar6 == (Value *)0x0) {
      std::__cxx11::string::operator+=((string *)local_30,"public ");
    }
    else {
      std::__cxx11::string::operator+=((string *)local_30,"internal ");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_member.field_2 + 8),code_ptr_local,"Union");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"Value",&local_a9);
    std::allocator<char>::~allocator(&local_a9);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,code_ptr_local);
    if (_Var4) {
      std::__cxx11::string::operator+=((string *)local_a8,"_");
    }
    std::operator+(&local_f0,"class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_member.field_2 + 8));
    std::operator+(&local_d0,&local_f0," {\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::operator+(&local_130,"  public ",code_ptr_local);
    std::operator+(&local_110,&local_130," Type { get; set; }\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::operator+(&local_170,"  public object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+(&local_150,&local_170," { get; set; }\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::operator+=((string *)local_30,"\n");
    std::operator+(&local_1b0,"  public ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_member.field_2 + 8));
    std::operator+(&local_190,&local_1b0,"() {\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::operator+(&local_230,"    this.Type = ",code_ptr_local);
    std::operator+(&local_210,&local_230,".");
    pvVar7 = EnumDef::Vals((EnumDef *)code_ptr_local);
    ppEVar8 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::
              operator[](pvVar7,0);
    std::operator+(&local_1f0,&local_210,&(*ppEVar8)->name);
    std::operator+(&local_1d0,&local_1f0,";\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::operator+(&local_270,"    this.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+(&local_250,&local_270," = null;\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::operator+=((string *)local_30,"  }\n\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   "  public T As<T>() where T : class { return this.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+(&local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   " as T; }\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&it);
    pvVar7 = EnumDef::Vals((EnumDef *)code_ptr_local);
    local_2b8._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar7)
    ;
    while( true ) {
      pvVar7 = EnumDef::Vals((EnumDef *)code_ptr_local);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar7)
      ;
      bVar5 = __gnu_cxx::operator!=
                        (&local_2b8,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar5) break;
      ppEVar9 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_2b8);
      type_name.field_2._8_8_ = *ppEVar9;
      if ((((EnumVal *)type_name.field_2._8_8_)->union_type).base_type != BASE_TYPE_NONE) {
        pTVar1 = &((EnumVal *)type_name.field_2._8_8_)->union_type;
        accessibility.field_2._8_4_ = pTVar1->base_type;
        accessibility.field_2._12_4_ = pTVar1->element;
        GenTypeGet_ObjectAPI_abi_cxx11_((string *)local_2e8,this,*pTVar1,(IDLOptions *)code);
        local_34a = 0;
        local_34b = 0;
        bVar5 = false;
        if (*(int *)(type_name.field_2._8_8_ + 0x38) == 0xf) {
          lVar2 = *(long *)(type_name.field_2._8_8_ + 0x40);
          std::allocator<char>::allocator();
          local_34a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"private",&local_349);
          local_34b = 1;
          pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                             ((SymbolTable<flatbuffers::Value> *)(lVar2 + 0x58),&local_348);
          bVar5 = pVVar6 != (Value *)0x0;
        }
        __s = "public";
        if (bVar5) {
          __s = "internal";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_328,__s,&local_34c);
        std::allocator<char>::~allocator(&local_34c);
        if ((local_34b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_348);
        }
        if ((local_34a & 1) != 0) {
          std::allocator<char>::~allocator(&local_349);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&lower_ev_name.field_2 + 8),"  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
        std::operator+(&local_430,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&lower_ev_name.field_2 + 8)," ");
        std::operator+(&local_410,&local_430,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e8);
        std::operator+(&local_3f0,&local_410," As");
        std::operator+(&local_3d0,&local_3f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       type_name.field_2._8_8_);
        std::operator+(&local_3b0,&local_3d0,"() { return this.As<");
        std::operator+(&local_390,&local_3b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e8);
        std::operator+(&local_370,&local_390,">(); }\n");
        std::__cxx11::string::operator+=((string *)local_30,(string *)&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)(lower_ev_name.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_470,(string *)type_name.field_2._8_8_);
        local_478._M_current = (char *)std::__cxx11::string::begin();
        local_480._M_current = (char *)std::__cxx11::string::end();
        local_488 = (char *)std::__cxx11::string::begin();
        local_490 = (char *)std::
                            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                                      (local_478,local_480,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_488,CharToLower);
        std::operator+(&local_710,"  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
        std::operator+(&local_6f0,&local_710," static ");
        std::operator+(&local_6d0,&local_6f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&class_member.field_2 + 8));
        std::operator+(&local_6b0,&local_6d0," From");
        std::operator+(&local_690,&local_6b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       type_name.field_2._8_8_);
        std::operator+(&local_670,&local_690,"(");
        std::operator+(&local_650,&local_670,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e8);
        std::operator+(&local_630,&local_650," _");
        std::operator+(&local_610,&local_630,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_470);
        std::operator+(&local_5f0,&local_610,") { return new ");
        std::operator+(&local_5d0,&local_5f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&class_member.field_2 + 8));
        std::operator+(&local_5b0,&local_5d0,"{ Type = ");
        Name_abi_cxx11_(&local_730,this,(Definition *)code_ptr_local);
        std::operator+(&local_590,&local_5b0,&local_730);
        std::operator+(&local_570,&local_590,".");
        Name_abi_cxx11_(&local_750,this,(EnumVal *)type_name.field_2._8_8_);
        std::operator+(&local_550,&local_570,&local_750);
        std::operator+(&local_530,&local_550,", ");
        std::operator+(&local_510,&local_530,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                      );
        std::operator+(&local_4f0,&local_510," = _");
        std::operator+(&local_4d0,&local_4f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_470);
        std::operator+(&local_4b0,&local_4d0," }; }\n");
        std::__cxx11::string::operator+=((string *)local_30,(string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_750);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::~string((string *)&local_730);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::~string((string *)&local_630);
        std::__cxx11::string::~string((string *)&local_650);
        std::__cxx11::string::~string((string *)&local_670);
        std::__cxx11::string::~string((string *)&local_690);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::__cxx11::string::~string((string *)&local_6f0);
        std::__cxx11::string::~string((string *)&local_710);
        std::__cxx11::string::~string((string *)local_470);
        std::__cxx11::string::~string((string *)local_328);
        std::__cxx11::string::~string((string *)local_2e8);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_2b8);
    }
    std::__cxx11::string::operator+=((string *)local_30,"\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                   "  public static int Pack(Google.FlatBuffers.FlatBufferBuilder builder, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_member.field_2 + 8));
    std::operator+(&local_770,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                   " _o) {\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_770);
    std::__cxx11::string::~string((string *)&local_770);
    std::__cxx11::string::~string((string *)&it_1);
    std::__cxx11::string::operator+=((string *)local_30,"    switch (_o.Type) {\n");
    pvVar7 = EnumDef::Vals((EnumDef *)code_ptr_local);
    local_798._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar7)
    ;
    while( true ) {
      pvVar7 = EnumDef::Vals((EnumDef *)code_ptr_local);
      ev_1 = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar7);
      bVar5 = __gnu_cxx::operator!=
                        (&local_798,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev_1);
      if (!bVar5) break;
      ppEVar9 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_798);
      local_7a8 = *ppEVar9;
      if ((local_7a8->union_type).base_type == BASE_TYPE_NONE) {
        std::__cxx11::string::operator+=((string *)local_30,"      default: return 0;\n");
      }
      else {
        Name_abi_cxx11_(&local_848,this,(Definition *)code_ptr_local);
        std::operator+(&local_828,"      case ",&local_848);
        std::operator+(&local_808,&local_828,".");
        Name_abi_cxx11_(&local_868,this,local_7a8);
        std::operator+(&local_7e8,&local_808,&local_868);
        std::operator+(&local_7c8,&local_7e8,": return ");
        std::__cxx11::string::operator+=((string *)local_30,(string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_868);
        std::__cxx11::string::~string((string *)&local_808);
        std::__cxx11::string::~string((string *)&local_828);
        std::__cxx11::string::~string((string *)&local_848);
        bVar5 = IsString(&local_7a8->union_type);
        if (bVar5) {
          std::operator+(&local_8a8,"builder.CreateString(_o.As",&local_7a8->name);
          std::operator+(&local_888,&local_8a8,"()).Value;\n");
          std::__cxx11::string::operator+=((string *)local_30,(string *)&local_888);
          std::__cxx11::string::~string((string *)&local_888);
          std::__cxx11::string::~string((string *)&local_8a8);
        }
        else {
          GenTypeGet_abi_cxx11_(&local_928,this,&local_7a8->union_type);
          std::operator+(&local_908,&local_928,".Pack(builder, _o.As");
          std::operator+(&local_8e8,&local_908,&local_7a8->name);
          std::operator+(&local_8c8,&local_8e8,"()).Value;\n");
          std::__cxx11::string::operator+=((string *)local_30,(string *)&local_8c8);
          std::__cxx11::string::~string((string *)&local_8c8);
          std::__cxx11::string::~string((string *)&local_8e8);
          std::__cxx11::string::~string((string *)&local_908);
          std::__cxx11::string::~string((string *)&local_928);
        }
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_798);
    }
    std::__cxx11::string::operator+=((string *)local_30,"    }\n");
    std::__cxx11::string::operator+=((string *)local_30,"  }\n");
    std::__cxx11::string::operator+=((string *)local_30,"}\n\n");
    if ((code[0xc]._M_string_length & 0x10000) != 0) {
      psVar3 = code_ptr_local + 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"private",&local_949);
      pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                         ((SymbolTable<flatbuffers::Value> *)((long)&psVar3->field_2 + 8),&local_948
                         );
      std::__cxx11::string::~string((string *)&local_948);
      std::allocator<char>::~allocator(&local_949);
      if (pVVar6 == (Value *)0x0) {
        std::__cxx11::string::operator+=((string *)local_30,"public ");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_30,"internal ");
      }
      std::operator+(&local_990,"class ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_970,&local_990,"_JsonConverter : Newtonsoft.Json.JsonConverter {\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_970);
      std::__cxx11::string::~string((string *)&local_970);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::operator+=
                ((string *)local_30,"  public override bool CanConvert(System.Type objectType) {\n")
      ;
      std::operator+(&local_a10,"    return objectType == typeof(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_9f0,&local_a10,
                     ") || objectType == typeof(System.Collections.Generic.List<");
      std::operator+(&local_9d0,&local_9f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_9b0,&local_9d0,">);\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::__cxx11::string::~string((string *)&local_9f0);
      std::__cxx11::string::~string((string *)&local_a10);
      std::__cxx11::string::operator+=((string *)local_30,"  }\n");
      std::__cxx11::string::operator+=
                ((string *)local_30,
                 "  public override void WriteJson(Newtonsoft.Json.JsonWriter writer, object value, Newtonsoft.Json.JsonSerializer serializer) {\n"
                );
      std::operator+(&local_a50,"    var _olist = value as System.Collections.Generic.List<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_a30,&local_a50,">;\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a30);
      std::__cxx11::string::~string((string *)&local_a30);
      std::__cxx11::string::~string((string *)&local_a50);
      std::__cxx11::string::operator+=((string *)local_30,"    if (_olist != null) {\n");
      std::__cxx11::string::operator+=((string *)local_30,"      writer.WriteStartArray();\n");
      std::__cxx11::string::operator+=
                ((string *)local_30,
                 "      foreach (var _o in _olist) { this.WriteJson(writer, _o, serializer); }\n");
      std::__cxx11::string::operator+=((string *)local_30,"      writer.WriteEndArray();\n");
      std::__cxx11::string::operator+=((string *)local_30,"    } else {\n");
      std::operator+(&local_a90,"      this.WriteJson(writer, value as ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_a70,&local_a90,", serializer);\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a70);
      std::__cxx11::string::~string((string *)&local_a70);
      std::__cxx11::string::~string((string *)&local_a90);
      std::__cxx11::string::operator+=((string *)local_30,"    }\n");
      std::__cxx11::string::operator+=((string *)local_30,"  }\n");
      std::operator+(&local_ad0,"  public void WriteJson(Newtonsoft.Json.JsonWriter writer, ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_ab0,&local_ad0," _o, Newtonsoft.Json.JsonSerializer serializer) {\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_ab0);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::__cxx11::string::~string((string *)&local_ad0);
      std::__cxx11::string::operator+=((string *)local_30,"    if (_o == null) return;\n");
      std::operator+(&local_b10,"    serializer.Serialize(writer, _o.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      std::operator+(&local_af0,&local_b10,");\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_af0);
      std::__cxx11::string::~string((string *)&local_af0);
      std::__cxx11::string::~string((string *)&local_b10);
      std::__cxx11::string::operator+=((string *)local_30,"  }\n");
      std::__cxx11::string::operator+=
                ((string *)local_30,
                 "  public override object ReadJson(Newtonsoft.Json.JsonReader reader, System.Type objectType, object existingValue, Newtonsoft.Json.JsonSerializer serializer) {\n"
                );
      std::operator+(&local_b50,"    var _olist = existingValue as System.Collections.Generic.List<"
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&class_member.field_2 + 8));
      std::operator+(&local_b30,&local_b50,">;\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_b30);
      std::__cxx11::string::~string((string *)&local_b30);
      std::__cxx11::string::~string((string *)&local_b50);
      std::__cxx11::string::operator+=((string *)local_30,"    if (_olist != null) {\n");
      std::__cxx11::string::operator+=
                ((string *)local_30,"      for (var _j = 0; _j < _olist.Count; ++_j) {\n");
      std::__cxx11::string::operator+=((string *)local_30,"        reader.Read();\n");
      std::__cxx11::string::operator+=
                ((string *)local_30,
                 "        _olist[_j] = this.ReadJson(reader, _olist[_j], serializer);\n");
      std::__cxx11::string::operator+=((string *)local_30,"      }\n");
      std::__cxx11::string::operator+=((string *)local_30,"      reader.Read();\n");
      std::__cxx11::string::operator+=((string *)local_30,"      return _olist;\n");
      std::__cxx11::string::operator+=((string *)local_30,"    } else {\n");
      std::operator+(&local_b90,"      return this.ReadJson(reader, existingValue as ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_b70,&local_b90,", serializer);\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_b70);
      std::__cxx11::string::~string((string *)&local_b70);
      std::__cxx11::string::~string((string *)&local_b90);
      std::__cxx11::string::operator+=((string *)local_30,"    }\n");
      std::__cxx11::string::operator+=((string *)local_30,"  }\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                     "  public ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_bf0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                     " ReadJson(Newtonsoft.Json.JsonReader reader, ");
      std::operator+(&local_bd0,&local_bf0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&class_member.field_2 + 8));
      std::operator+(&local_bb0,&local_bd0," _o, Newtonsoft.Json.JsonSerializer serializer) {\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_bb0);
      std::__cxx11::string::~string((string *)&local_bb0);
      std::__cxx11::string::~string((string *)&local_bd0);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::__cxx11::string::~string((string *)&it_2);
      std::__cxx11::string::operator+=((string *)local_30,"    if (_o == null) return null;\n");
      std::__cxx11::string::operator+=((string *)local_30,"    switch (_o.Type) {\n");
      pvVar7 = EnumDef::Vals((EnumDef *)code_ptr_local);
      local_c18._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar7);
      while( true ) {
        pvVar7 = EnumDef::Vals((EnumDef *)code_ptr_local);
        ev_2 = (EnumVal *)
               std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                         (pvVar7);
        bVar5 = __gnu_cxx::operator!=
                          (&local_c18,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev_2);
        if (!bVar5) break;
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_c18);
        type_name_1.field_2._8_8_ = *ppEVar9;
        if ((((EnumVal *)type_name_1.field_2._8_8_)->union_type).base_type == BASE_TYPE_NONE) {
          std::__cxx11::string::operator+=((string *)local_30,"      default: break;\n");
        }
        else {
          pTVar1 = &((EnumVal *)type_name_1.field_2._8_8_)->union_type;
          local_c68._0_4_ = pTVar1->base_type;
          local_c68._4_4_ = pTVar1->element;
          pSStack_c60 = (((EnumVal *)type_name_1.field_2._8_8_)->union_type).struct_def;
          local_c58 = (((EnumVal *)type_name_1.field_2._8_8_)->union_type).enum_def;
          uStack_c50 = *(undefined8 *)
                        &(((EnumVal *)type_name_1.field_2._8_8_)->union_type).fixed_length;
          GenTypeGet_ObjectAPI_abi_cxx11_((string *)local_c48,this,*pTVar1,(IDLOptions *)code);
          Name_abi_cxx11_(&local_d88,this,(Definition *)code_ptr_local);
          std::operator+(&local_d68,"      case ",&local_d88);
          std::operator+(&local_d48,&local_d68,".");
          Name_abi_cxx11_(&local_da8,this,(EnumVal *)type_name_1.field_2._8_8_);
          std::operator+(&local_d28,&local_d48,&local_da8);
          std::operator+(&local_d08,&local_d28,": _o.");
          std::operator+(&local_ce8,&local_d08,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8);
          std::operator+(&local_cc8,&local_ce8," = serializer.Deserialize<");
          std::operator+(&local_ca8,&local_cc8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c48);
          std::operator+(&local_c88,&local_ca8,">(reader); break;\n");
          std::__cxx11::string::operator+=((string *)local_30,(string *)&local_c88);
          std::__cxx11::string::~string((string *)&local_c88);
          std::__cxx11::string::~string((string *)&local_ca8);
          std::__cxx11::string::~string((string *)&local_cc8);
          std::__cxx11::string::~string((string *)&local_ce8);
          std::__cxx11::string::~string((string *)&local_d08);
          std::__cxx11::string::~string((string *)&local_d28);
          std::__cxx11::string::~string((string *)&local_da8);
          std::__cxx11::string::~string((string *)&local_d48);
          std::__cxx11::string::~string((string *)&local_d68);
          std::__cxx11::string::~string((string *)&local_d88);
          std::__cxx11::string::~string((string *)local_c48);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_c18);
      }
      std::__cxx11::string::operator+=((string *)local_30,"    }\n");
      std::__cxx11::string::operator+=((string *)local_30,"    return _o;\n");
      std::__cxx11::string::operator+=((string *)local_30,"  }\n");
      std::__cxx11::string::operator+=((string *)local_30,"}\n\n");
    }
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(class_member.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void GenEnum_ObjectAPI(EnumDef &enum_def, std::string *code_ptr,
                         const IDLOptions &opts) const {
    auto &code = *code_ptr;
    if (enum_def.generated) return;
    if (!enum_def.is_union) return;
    if (enum_def.attributes.Lookup("private")) {
      code += "internal ";
    } else {
      code += "public ";
    }
    auto union_name = enum_def.name + "Union";
    auto class_member = std::string("Value");
    if (class_member == enum_def.name) { class_member += "_"; };
    code += "class " + union_name + " {\n";
    // Type
    code += "  public " + enum_def.name + " Type { get; set; }\n";
    // Value
    code += "  public object " + class_member + " { get; set; }\n";
    code += "\n";
    // Constructor
    code += "  public " + union_name + "() {\n";
    code += "    this.Type = " + enum_def.name + "." +
            enum_def.Vals()[0]->name + ";\n";
    code += "    this." + class_member + " = null;\n";
    code += "  }\n\n";
    // As<T>
    code += "  public T As<T>() where T : class { return this." + class_member +
            " as T; }\n";
    // As, From
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (ev.union_type.base_type == BASE_TYPE_NONE) continue;
      auto type_name = GenTypeGet_ObjectAPI(ev.union_type, opts);
      std::string accessibility =
          (ev.union_type.base_type == BASE_TYPE_STRUCT &&
           ev.union_type.struct_def->attributes.Lookup("private"))
              ? "internal"
              : "public";
      // As
      code += "  " + accessibility + " " + type_name + " As" + ev.name +
              "() { return this.As<" + type_name + ">(); }\n";
      // From
      auto lower_ev_name = ev.name;
      std::transform(lower_ev_name.begin(), lower_ev_name.end(),
                     lower_ev_name.begin(), CharToLower);
      code += "  " + accessibility + " static " + union_name + " From" +
              ev.name + "(" + type_name + " _" + lower_ev_name +
              ") { return new " + union_name + "{ Type = " + Name(enum_def) +
              "." + Name(ev) + ", " + class_member + " = _" + lower_ev_name +
              " }; }\n";
    }
    code += "\n";
    // Pack()
    code +=
        "  public static int Pack(Google.FlatBuffers.FlatBufferBuilder "
        "builder, " +
        union_name + " _o) {\n";
    code += "    switch (_o.Type) {\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        code += "      default: return 0;\n";
      } else {
        code += "      case " + Name(enum_def) + "." + Name(ev) + ": return ";
        if (IsString(ev.union_type)) {
          code += "builder.CreateString(_o.As" + ev.name + "()).Value;\n";
        } else {
          code += GenTypeGet(ev.union_type) + ".Pack(builder, _o.As" + ev.name +
                  "()).Value;\n";
        }
      }
    }
    code += "    }\n";
    code += "  }\n";
    code += "}\n\n";

    // JsonConverter
    if (opts.cs_gen_json_serializer) {
      if (enum_def.attributes.Lookup("private")) {
        code += "internal ";
      } else {
        code += "public ";
      }
      code += "class " + union_name +
              "_JsonConverter : Newtonsoft.Json.JsonConverter {\n";
      code += "  public override bool CanConvert(System.Type objectType) {\n";
      code += "    return objectType == typeof(" + union_name +
              ") || objectType == typeof(System.Collections.Generic.List<" +
              union_name + ">);\n";
      code += "  }\n";
      code +=
          "  public override void WriteJson(Newtonsoft.Json.JsonWriter writer, "
          "object value, "
          "Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    var _olist = value as System.Collections.Generic.List<" +
              union_name + ">;\n";
      code += "    if (_olist != null) {\n";
      code += "      writer.WriteStartArray();\n";
      code +=
          "      foreach (var _o in _olist) { this.WriteJson(writer, _o, "
          "serializer); }\n";
      code += "      writer.WriteEndArray();\n";
      code += "    } else {\n";
      code += "      this.WriteJson(writer, value as " + union_name +
              ", serializer);\n";
      code += "    }\n";
      code += "  }\n";
      code += "  public void WriteJson(Newtonsoft.Json.JsonWriter writer, " +
              union_name +
              " _o, "
              "Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    if (_o == null) return;\n";
      code += "    serializer.Serialize(writer, _o." + class_member + ");\n";
      code += "  }\n";
      code +=
          "  public override object ReadJson(Newtonsoft.Json.JsonReader "
          "reader, "
          "System.Type objectType, "
          "object existingValue, Newtonsoft.Json.JsonSerializer serializer) "
          "{\n";
      code +=
          "    var _olist = existingValue as System.Collections.Generic.List<" +
          union_name + ">;\n";
      code += "    if (_olist != null) {\n";
      code += "      for (var _j = 0; _j < _olist.Count; ++_j) {\n";
      code += "        reader.Read();\n";
      code +=
          "        _olist[_j] = this.ReadJson(reader, _olist[_j], "
          "serializer);\n";
      code += "      }\n";
      code += "      reader.Read();\n";
      code += "      return _olist;\n";
      code += "    } else {\n";
      code += "      return this.ReadJson(reader, existingValue as " +
              union_name + ", serializer);\n";
      code += "    }\n";
      code += "  }\n";
      code += "  public " + union_name +
              " ReadJson(Newtonsoft.Json.JsonReader reader, " + union_name +
              " _o, Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    if (_o == null) return null;\n";
      code += "    switch (_o.Type) {\n";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        auto &ev = **it;
        if (ev.union_type.base_type == BASE_TYPE_NONE) {
          code += "      default: break;\n";
        } else {
          auto type_name = GenTypeGet_ObjectAPI(ev.union_type, opts);
          code += "      case " + Name(enum_def) + "." + Name(ev) + ": _o." +
                  class_member + " = serializer.Deserialize<" + type_name +
                  ">(reader); break;\n";
        }
      }
      code += "    }\n";
      code += "    return _o;\n";
      code += "  }\n";
      code += "}\n\n";
    }
  }